

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O0

void Cec2_ManSaveCis(Gia_Man_t *p)

{
  Vec_Wrd_t *p_00;
  int iVar1;
  Gia_Obj_t *pObj;
  word *pwVar2;
  bool bVar3;
  int local_1c;
  int local_18;
  int Id;
  int i;
  int w;
  Gia_Man_t *p_local;
  
  if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
    for (Id = 0; Id < p->nSimWords; Id = Id + 1) {
      local_18 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar3 = false;
        if (local_18 < iVar1) {
          pObj = Gia_ManCi(p,local_18);
          local_1c = Gia_ObjId(p,pObj);
          bVar3 = local_1c != 0;
        }
        if (!bVar3) break;
        p_00 = p->vSimsPi;
        pwVar2 = Cec2_ObjSim(p,local_1c);
        Vec_WrdPush(p_00,pwVar2[Id]);
        local_18 = local_18 + 1;
      }
    }
    return;
  }
  __assert_fail("p->vSimsPi != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                ,0x1fa,"void Cec2_ManSaveCis(Gia_Man_t *)");
}

Assistant:

void Cec2_ManSaveCis( Gia_Man_t * p )
{
    int w, i, Id;
    assert( p->vSimsPi != NULL );
    for ( w = 0; w < p->nSimWords; w++ )
        Gia_ManForEachCiId( p, Id, i )
            Vec_WrdPush( p->vSimsPi, Cec2_ObjSim(p, Id)[w] );
}